

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O3

void wait_for_entropy(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  ulong uVar6;
  long in_RCX;
  long extraout_RDX;
  long *plVar7;
  uint *buf;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  uint8_t dummy;
  undefined1 local_11;
  long local_10;
  
  if ((urandom_fd == -3) && (getrandom_ready == '\0')) {
    buf = (uint *)&local_11;
    plVar7 = (long *)0x1;
    sVar4 = boringssl_getrandom(buf,1,1);
    if (sVar4 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 != 0xb) goto LAB_0047e2ba;
      buf = (uint *)&local_11;
      plVar7 = &local_10;
      wait_for_entropy();
      sVar4 = local_10;
    }
    if (sVar4 != 1) {
LAB_0047e2ba:
      wait_for_entropy();
      uVar3 = *buf;
      uVar6 = (ulong)uVar3;
      uVar8 = buf[1];
      uVar9 = (ulong)uVar8;
      if (plVar7 != (long *)0x0) {
        plVar10 = (long *)0x0;
        do {
          uVar3 = (int)uVar6 + 1U & 0xff;
          uVar6 = (ulong)uVar3;
          uVar1 = buf[uVar6 + 2];
          uVar8 = (int)uVar9 + uVar1 & 0xff;
          uVar9 = (ulong)uVar8;
          uVar2 = buf[uVar9 + 2];
          buf[uVar6 + 2] = uVar2;
          buf[uVar9 + 2] = uVar1;
          *(byte *)(in_RCX + (long)plVar10) =
               *(byte *)(extraout_RDX + (long)plVar10) ^
               (byte)buf[(ulong)(uVar2 + uVar1 & 0xff) + 2];
          plVar10 = (long *)((long)plVar10 + 1);
        } while (plVar7 != plVar10);
      }
      *buf = uVar3;
      buf[1] = uVar8;
      return;
    }
  }
  return;
}

Assistant:

static void wait_for_entropy(void) {
  int fd = urandom_fd;
  if (fd == kHaveGetrandom) {
    // |getrandom| and |getentropy| support blocking in |fill_with_entropy|
    // directly. For |getrandom|, we first probe with a non-blocking call to aid
    // debugging.
#if defined(USE_NR_getrandom)
    if (getrandom_ready) {
      // The entropy pool was already initialized in |init_once|.
      return;
    }

    uint8_t dummy;
    ssize_t getrandom_ret =
        boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
    if (getrandom_ret == -1 && errno == EAGAIN) {
      // Attempt to get the path of the current process to aid in debugging when
      // something blocks.
      const char *current_process = "<unknown>";
#if defined(OPENSSL_HAS_GETAUXVAL)
      const unsigned long getauxval_ret = getauxval(AT_EXECFN);
      if (getauxval_ret != 0) {
        current_process = (const char *)getauxval_ret;
      }
#endif

      fprintf(
          stderr,
          "%s: getrandom indicates that the entropy pool has not been "
          "initialized. Rather than continue with poor entropy, this process "
          "will block until entropy is available.\n",
          current_process);

      getrandom_ret =
          boringssl_getrandom(&dummy, sizeof(dummy), 0 /* no flags */);
    }

    if (getrandom_ret != 1) {
      perror("getrandom");
      abort();
    }
#endif  // USE_NR_getrandom
    return;
  }
}